

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>
                   (string *__return_storage_ptr__,char (*a) [33],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [10],long *args_1,char (*args_2) [17],unsigned_long *args_3,
                   char (*args_4) [3],unsigned_long *args_5,char (*args_6) [3])

{
  cmAlphaNum *pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  undefined1 local_1b0 [56];
  undefined1 local_178 [56];
  undefined1 local_140 [56];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_108;
  size_type local_f0;
  pointer local_e8;
  undefined8 local_e0;
  size_t local_d8;
  char (*local_d0) [10];
  undefined8 local_c8;
  size_t local_c0;
  string *local_b8;
  cmAlphaNum *local_b0;
  size_t local_a8;
  char (*local_a0) [17];
  undefined8 local_98;
  size_t local_90;
  string *local_88;
  cmAlphaNum *local_80;
  size_t local_78;
  char (*local_70) [3];
  undefined8 local_68;
  size_t local_60;
  string *local_58;
  cmAlphaNum *local_50;
  size_t local_48;
  char (*local_40) [3];
  undefined8 local_38;
  
  local_108.first._M_len = strlen(*a);
  local_108.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_e8 = (b->_M_dataplus)._M_p;
  local_f0 = b->_M_string_length;
  local_e0 = 0;
  local_108.first._M_str = *a;
  local_d8 = strlen(*args);
  local_c8 = 0;
  local_d0 = args;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_140,*args_1);
  pcVar1 = (cmAlphaNum *)(local_140 + 0x10);
  if ((cmAlphaNum *)local_140._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_140._0_8_;
  }
  local_b8 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_140;
  if ((cmAlphaNum *)local_140._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_140._0_8_;
  }
  local_c0 = (pcVar1->View_)._M_len;
  local_b0 = (cmAlphaNum *)local_140._0_8_;
  local_a8 = strlen(*args_2);
  local_98 = 0;
  local_a0 = args_2;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_178,*args_3);
  pcVar1 = (cmAlphaNum *)(local_178 + 0x10);
  if ((cmAlphaNum *)local_178._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_178._0_8_;
  }
  local_88 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_178;
  if ((cmAlphaNum *)local_178._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_178._0_8_;
  }
  local_90 = (pcVar1->View_)._M_len;
  local_80 = (cmAlphaNum *)local_178._0_8_;
  local_78 = strlen(*args_4);
  local_70 = args_4;
  local_68 = 0;
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_1b0,*args_5);
  pcVar1 = (cmAlphaNum *)(local_1b0 + 0x10);
  if ((cmAlphaNum *)local_1b0._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_1b0._0_8_;
  }
  local_58 = pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_1b0;
  if ((cmAlphaNum *)local_1b0._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_1b0._0_8_;
  }
  local_60 = (pcVar1->View_)._M_len;
  local_50 = (cmAlphaNum *)local_1b0._0_8_;
  local_48 = strlen(*args_6);
  local_40 = args_6;
  local_38 = 0;
  views._M_len = 9;
  views._M_array = &local_108;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}